

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_nivplot.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  long in_RSI;
  int in_EDI;
  thread thd;
  ImGuiStyle *style;
  char *glsl_version;
  ImGuiIO *io;
  int i;
  ImGuiStyle *in_stack_00000260;
  size_t in_stack_00000528;
  Plotter *in_stack_00000530;
  Plotter *__t;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  size_t in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  uint *handle;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  ImFontAtlas *in_stack_ffffffffffffff30;
  _func_void_Plotter_ptr *in_stack_ffffffffffffff38;
  thread *in_stack_ffffffffffffff40;
  reference_wrapper<nivalis::Plotter> local_a8;
  ImVec4 local_a0;
  ImVec4 local_90;
  ImVec4 local_80;
  ImWchar *in_stack_ffffffffffffff90;
  ImFontConfig *in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  void *in_stack_ffffffffffffffa8;
  ImFontAtlas *in_stack_ffffffffffffffb0;
  float fStack_48;
  float fStack_44;
  ImVec4 local_40;
  ImGuiStyle *local_30;
  undefined8 local_28;
  ImGuiIO *local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  for (local_14 = 1; local_14 < local_8; local_14 = local_14 + 1) {
    if (1 < local_14) {
      nivalis::Plotter::add_func
                ((Plotter *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    in_stack_ffffffffffffff38 = *(_func_void_Plotter_ptr **)(local_10 + (long)local_14 * 8);
    pvVar3 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                       ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                        ((anonymous_namespace)::plot + 0x40),(long)(local_14 + -1));
    std::__cxx11::string::operator=((string *)&pvVar3->expr_str,(char *)in_stack_ffffffffffffff38);
    nivalis::Plotter::reparse_expr(in_stack_00000530,in_stack_00000528);
  }
  bVar1 = init_gl();
  if (bVar1) {
    __t = (Plotter *)0x4;
    ImGui::DebugCheckVersionAndDataLayout
              (in_stack_ffffffffffffff20,
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),4,
               (size_t)in_stack_ffffffffffffff30);
    ImGui::CreateContext(in_stack_ffffffffffffff30);
    local_20 = ImGui::GetIO();
    nivalis::GetGlyphRangesGreek();
    handle = ROBOTO_compressed_data;
    (anonymous_namespace)::font_sm =
         ImFontAtlas::AddFontFromMemoryCompressedTTF
                   (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                    (int)in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                    in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    (anonymous_namespace)::font_md =
         ImFontAtlas::AddFontFromMemoryCompressedTTF
                   (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                    (int)in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                    in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    ImGui_ImplGlfw_InitForOpenGL
              ((GLFWwindow *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               SUB81((ulong)__t >> 0x38,0));
    local_28 = 0;
    ImGui_ImplOpenGL3_Init((char *)handle);
    ImGui::StyleColorsLight(in_stack_00000260);
    local_30 = ImGui::GetStyle();
    local_30->WindowRounding = 0.0;
    local_30->WindowBorderSize = 1.0;
    local_30->FrameBorderSize = 0.0;
    ImVec4::ImVec4(&local_40,0.8,0.8,0.8,1.0);
    local_30->Colors[5].x = local_40.x;
    local_30->Colors[5].y = local_40.y;
    local_30->Colors[5].z = local_40.z;
    local_30->Colors[5].w = local_40.w;
    ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffb0,0.0,0.0,0.0,0.0);
    *(ImFontAtlas **)(local_30->Colors + 6) = in_stack_ffffffffffffffb0;
    local_30->Colors[6].z = fStack_48;
    local_30->Colors[6].w = fStack_44;
    ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffa0,0.75,0.75,0.75,1.0);
    local_30->Colors[10].x = in_stack_ffffffffffffffa0;
    local_30->Colors[10].y = in_stack_ffffffffffffffa4;
    *(void **)&local_30->Colors[10].z = in_stack_ffffffffffffffa8;
    ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff90,0.7,0.7,0.7,1.0);
    *(ImWchar **)(local_30->Colors + 0xb) = in_stack_ffffffffffffff90;
    *(ImFontConfig **)&local_30->Colors[0xb].z = in_stack_ffffffffffffff98;
    ImVec4::ImVec4(&local_80,0.75,0.75,0.75,1.0);
    local_30->Colors[0xc].x = local_80.x;
    local_30->Colors[0xc].y = local_80.y;
    local_30->Colors[0xc].z = local_80.z;
    local_30->Colors[0xc].w = local_80.w;
    ImVec4::ImVec4(&local_90,0.99,0.99,0.99,1.0);
    local_30->Colors[2].x = local_90.x;
    local_30->Colors[2].y = local_90.y;
    local_30->Colors[2].z = local_90.z;
    local_30->Colors[2].w = local_90.w;
    ImVec4::ImVec4(&local_a0,0.94,0.94,0.94,1.0);
    local_30->Colors[7].x = local_a0.x;
    local_30->Colors[7].y = local_a0.y;
    local_30->Colors[7].z = local_a0.z;
    local_30->Colors[7].w = local_a0.w;
    std::ref<nivalis::Plotter>(__t);
    std::thread::thread<void(&)(nivalis::Plotter&),std::reference_wrapper<nivalis::Plotter>,void>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,&local_a8);
    std::thread::detach();
    while( true ) {
      iVar2 = glfwWindowShouldClose((GLFWwindow *)__t);
      if (iVar2 != 0) break;
      anon_unknown.dwarf_10666::main_loop_step();
    }
    (anonymous_namespace)::run_worker_flag = 1;
    (anonymous_namespace)::worker_quit_flag = 1;
    std::condition_variable::notify_one();
    ImGui_ImplOpenGL3_Shutdown();
    ImGui_ImplGlfw_Shutdown();
    ImGui::DestroyContext((ImGuiContext *)0x11a554);
    glfwDestroyWindow((GLFWwindow *)handle);
    std::thread::~thread((thread *)0x11a56e);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    using namespace nivalis;
    for (int i = 1; i < argc; ++i) {
        if (i > 1) plot.add_func();
        // Load the expression
        plot.funcs[i - 1].expr_str = argv[i];
        plot.reparse_expr(i - 1);
    }
    if (!init_gl()) return 1; // GL initialization failed

    // Setup Dear ImGUI context
    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO();
    font_sm = io.Fonts->AddFontFromMemoryCompressedTTF(ROBOTO_compressed_data,
            ROBOTO_compressed_size, 16.0f, NULL, GetGlyphRangesGreek());
    font_md = io.Fonts->AddFontFromMemoryCompressedTTF(ROBOTO_compressed_data,
            ROBOTO_compressed_size, 18.0f, NULL);

    // Setup Platform/Renderer bindings
    ImGui_ImplGlfw_InitForOpenGL(window, true);
    char* glsl_version = NULL;
    ImGui_ImplOpenGL3_Init(glsl_version);
    // Setup Dear ImGui style
    ImGui::StyleColorsLight();
    ImGuiStyle& style = ImGui::GetStyle();
    style.WindowRounding = 0.;
    style.WindowBorderSize = 1.;
    style.FrameBorderSize = 0.;
    style.Colors[ImGuiCol_Border]         = ImVec4(0.8f, 0.8f, 0.8f, 1.f);
    style.Colors[ImGuiCol_BorderShadow]   = ImVec4(0.f, 0.f, 0.f, 0.f);
    style.Colors[ImGuiCol_TitleBg]        = ImVec4(0.75f, 0.75f, 0.75f, 1.0f);
    style.Colors[ImGuiCol_TitleBgActive]    = ImVec4(0.7f, 0.7f, 0.7f, 1.f);
    style.Colors[ImGuiCol_TitleBgCollapsed] = ImVec4(0.75, 0.75f, 0.75f, 1.f);
    style.Colors[ImGuiCol_WindowBg]       = ImVec4(0.99f, 0.99f, 0.99f, 1.f);
    style.Colors[ImGuiCol_FrameBg]       = ImVec4(0.94f, 0.94f, 0.94f, 1.f);

    // Start worker thread
    std::thread thd(draw_worker, std::ref(plot));
    thd.detach();

    // Main GLFW loop (desktop)
    while (!glfwWindowShouldClose(window)) {
        main_loop_step();
    } // Main loop
    // Cleanup
    run_worker_flag = true;
    worker_quit_flag = true;
    worker_cv.notify_one();
    ImGui_ImplOpenGL3_Shutdown();
    ImGui_ImplGlfw_Shutdown();
    ImGui::DestroyContext();
    glfwDestroyWindow(window);
}